

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O2

void borg_send_inscribe(wchar_t i,char *str)

{
  ushort uVar1;
  
  borg_keypress(0x7b);
  uVar1 = z_info->pack_size;
  if ((int)(uint)uVar1 <= i) {
    if (borg_items->iqty != '\0') {
      borg_keypress(0x2f);
      uVar1 = z_info->pack_size;
    }
    i = i - (uint)uVar1;
  }
  borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i]);
  for (; *str != '\0'; str = str + 1) {
    borg_keypress((int)*str);
  }
  borg_keypress(0x9c);
  return;
}

Assistant:

void borg_send_inscribe(int i, char* str)
{
    char* s;

    /* Label it */
    borg_keypress('{');

    /* Choose from inventory */
    if (i < INVEN_WIELD) {
        /* Choose the item */
        borg_keypress(all_letters_nohjkl[i]);
    }

    /* Choose from equipment */
    else {
        /* Go to equipment (if necessary) */
        if (borg_items[0].iqty)
            borg_keypress('/');

        /* Choose the item */
        borg_keypress(all_letters_nohjkl[i - INVEN_WIELD]);
    }

    /* Send the label */
    for (s = str; *s; s++)
        borg_keypress(*s);

    /* End the inscription */
    borg_keypress(KC_ENTER);
}